

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

bool isFatalCountDown(char *varname,QBasicAtomicInt *n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  bool local_49;
  QByteArray local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (n->_q_value).super___atomic_base<int>._M_i;
  if (iVar3 == 0) {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    qgetenv(&local_48,varname);
    if ((undefined1 *)local_48.d.size == (undefined1 *)0x0) {
      iVar2 = 0;
    }
    else {
      local_49 = true;
      iVar1 = QByteArray::toInt(&local_48,&local_49,0);
      iVar2 = 1;
      if (local_49 != false) {
        iVar2 = iVar1;
      }
      if (iVar1 < 0) {
        iVar2 = 1;
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (iVar2 == 1) {
      bVar5 = true;
LAB_002143a7:
      bVar4 = false;
    }
    else {
      if (iVar2 == 0) {
        (n->_q_value).super___atomic_base<int>._M_i = 1;
        bVar5 = false;
        goto LAB_002143a7;
      }
      bVar5 = false;
      LOCK();
      iVar3 = (n->_q_value).super___atomic_base<int>._M_i;
      bVar4 = iVar3 == 0;
      if (bVar4) {
        (n->_q_value).super___atomic_base<int>._M_i = iVar2;
        iVar3 = 0;
      }
      UNLOCK();
      bVar4 = !bVar4;
    }
    if (!bVar4) goto LAB_002143e2;
  }
  do {
    if (iVar3 < 3) break;
    LOCK();
    iVar2 = (n->_q_value).super___atomic_base<int>._M_i;
    bVar5 = iVar3 == iVar2;
    if (bVar5) {
      (n->_q_value).super___atomic_base<int>._M_i = iVar3 + -1;
      iVar2 = iVar3;
    }
    iVar3 = iVar2;
    UNLOCK();
  } while (!bVar5);
  bVar5 = iVar3 == 2;
LAB_002143e2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

static bool isFatalCountDown(const char *varname, QBasicAtomicInt &n)
{
    static const int Uninitialized = 0;
    static const int NeverFatal = 1;
    static const int ImmediatelyFatal = 2;

    int v = n.loadRelaxed();
    if (v == Uninitialized) {
        // first, initialize from the environment
        // note that the atomic stores the env.var value plus 1, so adjust
        const int env = checked_var_value(varname) + 1;
        if (env == NeverFatal) {
            // not fatal, now or in the future, so use a fast path
            n.storeRelaxed(NeverFatal);
            return false;
        } else if (env == ImmediatelyFatal) {
            return true;
        } else if (n.testAndSetRelaxed(Uninitialized, env - 1, v)) {
            return false;       // not yet fatal, but decrement
        } else {
            // some other thread initialized before we did
        }
    }

    while (v > ImmediatelyFatal && !n.testAndSetRelaxed(v, v - 1, v))
        qYieldCpu();

    // We exited the loop, so either v already was ImmediatelyFatal or we
    // succeeded to set n from v to v-1.
    return v == ImmediatelyFatal;
}